

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O3

bool __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_53::ConvertWCharTImpl
          (anon_unknown_53 *this,wchar_t v,FormatConversionSpecImpl conv,FormatSinkImpl *sink)

{
  ulong uVar1;
  bool bVar2;
  undefined8 in_RAX;
  FormatSinkImpl *this_00;
  byte bVar3;
  int in_register_00000034;
  size_t sVar4;
  undefined1 uVar5;
  uint uVar6;
  string_view value;
  string_view v_00;
  char mb [4];
  undefined8 uStack_8;
  
  this_00 = (FormatSinkImpl *)CONCAT44((int)((ulong)register0x00000008 >> 0x20),conv.precision_);
  uVar6 = (uint)this;
  uVar5 = SUB81(this,0);
  uStack_8._0_4_ = (undefined4)in_RAX;
  uStack_8._5_3_ = (undefined3)((ulong)in_RAX >> 0x28);
  if (uVar6 < 0x80) {
    uStack_8._0_5_ = CONCAT14(uVar5,(undefined4)uStack_8);
    sVar4 = 1;
  }
  else {
    uStack_8._6_2_ = (undefined2)((ulong)in_RAX >> 0x30);
    if (uVar6 < 0x800) {
      uStack_8 = CONCAT26(uStack_8._6_2_,
                          CONCAT15(uVar5,CONCAT14((char)((ulong)this >> 6),(undefined4)uStack_8))) &
                 0xffff3fffffffffff | 0x80c000000000;
      sVar4 = 2;
    }
    else if (uVar6 < 0xd800 || (uVar6 & 0xffffe000) == 0xe000) {
      uVar1 = CONCAT26(uStack_8._6_2_,
                       CONCAT15((char)((ulong)this >> 6),
                                CONCAT14((char)((ulong)this >> 0xc),(undefined4)uStack_8))) &
              0xffff3fffffffffff;
      uStack_8._7_1_ = (undefined1)(uVar1 >> 0x38);
      uStack_8 = CONCAT17(uStack_8._7_1_,CONCAT16(uVar5,(int6)uVar1)) & 0xff3fffffffffffff |
                 0x8080e000000000;
      sVar4 = 3;
    }
    else {
      if (0xfffff < uVar6 - 0x10000) {
        return false;
      }
      uStack_8 = CONCAT17(uVar5,CONCAT16((char)((ulong)this >> 6),
                                         CONCAT15((char)((ulong)this >> 0xc),
                                                  CONCAT14((char)((ulong)this >> 0x12),
                                                           (undefined4)uStack_8)))) &
                 0x3f3f3fffffffffff | 0x808080f000000000;
      sVar4 = 4;
    }
  }
  bVar3 = (byte)((uint)v >> 8);
  if (bVar3 == 0) {
    v_00._M_str = (char *)((long)&uStack_8 + 4);
    v_00._M_len = sVar4;
    FormatSinkImpl::Append(this_00,v_00);
    bVar2 = true;
  }
  else {
    value._M_str = (char *)((long)&uStack_8 + 4);
    value._M_len = sVar4;
    bVar2 = FormatSinkImpl::PutPaddedString
                      (this_00,value,in_register_00000034,conv._0_4_,(bool)(bVar3 & 1));
  }
  return bVar2;
}

Assistant:

bool ConvertWCharTImpl(wchar_t v, const FormatConversionSpecImpl conv,
                       FormatSinkImpl *sink) {
  char mb[4];
  ShiftState s;
  const size_t chars_written = WideToUtf8(v, mb, s);
  return chars_written != static_cast<size_t>(-1) && !s.saw_high_surrogate &&
         ConvertStringArg(string_view(mb, chars_written), conv, sink);
}